

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::TapScriptFromStringRequest::TapScriptFromStringRequest
          (TapScriptFromStringRequest *this)

{
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  TapScriptFromStringRequest *local_10;
  TapScriptFromStringRequest *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::TapScriptFromStringRequest>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::TapScriptFromStringRequest>);
  (this->super_JsonClassBase<cfd::js::api::json::TapScriptFromStringRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__TapScriptFromStringRequest_01b46588;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->network_,"mainnet",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  this->is_elements_ = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->tree_string_,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->tapscript_,"",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->internal_pubkey_,"",&local_27);
  std::allocator<char>::~allocator((allocator<char> *)&local_27);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->internal_privkey_,"",&local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_28);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::JsonValueVector(&this->nodes_);
  CollectFieldName();
  return;
}

Assistant:

TapScriptFromStringRequest() {
    CollectFieldName();
  }